

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExternModuleDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternModuleDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ModuleHeaderSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,
          ModuleHeaderSyntax *args_3)

{
  Token externKeyword;
  ExternModuleDeclSyntax *this_00;
  
  this_00 = (ExternModuleDeclSyntax *)allocate(this,0x88,8);
  externKeyword.kind = args_1->kind;
  externKeyword._2_1_ = args_1->field_0x2;
  externKeyword.numFlags.raw = (args_1->numFlags).raw;
  externKeyword.rawLen = args_1->rawLen;
  externKeyword.info = args_1->info;
  slang::syntax::ExternModuleDeclSyntax::ExternModuleDeclSyntax
            (this_00,args,externKeyword,args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }